

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_lad.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  void *pvVar8;
  undefined8 *in_RSI;
  GraphFileError *e;
  error *e_1;
  exception *e_2;
  int j;
  int i;
  InputGraph graph;
  string pattern_format_name;
  variables_map options_vars;
  positional_options_description positional_options;
  options_description all_options;
  options_description display_options;
  string *in_stack_fffffffffffffa58;
  basic_command_line_parser<char> *in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa6c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffa70;
  allocator<char> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaac;
  InputGraph *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  int in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  basic_command_line_parser<char> *in_stack_fffffffffffffad8;
  int local_3ec;
  int local_3e8;
  allocator<char> local_3e1 [44];
  byte local_3b5;
  allocator<char> local_3b4;
  byte local_3b3;
  byte local_3b2;
  allocator<char> local_3b1 [40];
  allocator<char> local_389 [72];
  allocator<char> local_341 [33];
  undefined4 local_320;
  allocator<char> local_319 [153];
  basic_parsed_options local_280 [40];
  variables_map local_258 [72];
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  positional_options_description local_1b8 [56];
  undefined8 local_180;
  allocator<char> local_171;
  string local_170 [32];
  options_description local_150 [128];
  undefined8 local_d0 [3];
  allocator<char> local_b1;
  string local_b0 [32];
  options_description local_90 [128];
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  boost::program_options::options_description::options_description
            (local_90,local_b0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
  std::allocator<char>::~allocator(&local_b1);
  local_d0[0] = boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d0,"help");
  ptVar5 = boost::program_options::value<std::__cxx11::string>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)0x150a4f,(char *)ptVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  boost::program_options::options_description::options_description
            (local_150,local_170,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
  std::allocator<char>::~allocator(&local_171);
  local_180 = boost::program_options::options_description::add_options();
  boost::program_options::options_description_easy_init::operator()((char *)&local_180,"graph-file")
  ;
  boost::program_options::options_description::add(local_150);
  boost::program_options::positional_options_description::positional_options_description(local_1b8);
  boost::program_options::positional_options_description::add((char *)local_1b8,0x1500be);
  boost::program_options::variables_map::variables_map(local_258);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),in_stack_fffffffffffffacc
             ,(char **)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  boost::program_options::basic_command_line_parser<char>::options
            (in_stack_fffffffffffffa60,(options_description *)in_stack_fffffffffffffa58);
  boost::program_options::basic_command_line_parser<char>::positional
            (in_stack_fffffffffffffa60,(positional_options_description *)in_stack_fffffffffffffa58);
  boost::program_options::basic_command_line_parser<char>::run(in_stack_fffffffffffffad8);
  boost::program_options::store(local_280,local_258,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x108ad0);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x108add);
  boost::program_options::notify(local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffa70,
                  (key_type *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60);
  std::allocator<char>::~allocator(local_319);
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,in_stack_fffffffffffffa90
              );
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(in_stack_fffffffffffffa70,
                    (key_type *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa60);
    std::allocator<char>::~allocator(local_341);
    if (sVar6 == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar7 = std::operator<<(poVar7,(char *)*local_10);
      poVar7 = std::operator<<(poVar7," [options] graph-file");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_320 = 1;
    }
    else {
      std::allocator<char>::allocator();
      local_3b2 = 0;
      local_3b3 = 0;
      local_3b5 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90);
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(in_stack_fffffffffffffa70,
                      (key_type *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      if (sVar6 == 0) {
        std::allocator<char>::allocator();
        local_3b5 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
                   in_stack_fffffffffffffa90);
      }
      else {
        std::allocator<char>::allocator();
        local_3b2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
                   in_stack_fffffffffffffa90);
        local_3b3 = 1;
        boost::program_options::variables_map::operator[]
                  ((variables_map *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x10904f)
        ;
        std::__cxx11::string::string(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      }
      if ((local_3b5 & 1) != 0) {
        std::allocator<char>::~allocator(&local_3b4);
      }
      if ((local_3b3 & 1) != 0) {
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa60);
      }
      if ((local_3b2 & 1) != 0) {
        std::allocator<char>::~allocator(local_3b1);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
      std::allocator<char>::~allocator(local_389);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98,
                 in_stack_fffffffffffffa90);
      boost::program_options::variables_map::operator[]
                ((variables_map *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x109173);
      read_file_format(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
      std::allocator<char>::~allocator(local_3e1);
      bVar1 = InputGraph::has_vertex_labels((InputGraph *)0x1091c3);
      if ((bVar1) || (bVar1 = InputGraph::has_edge_labels((InputGraph *)0x1091e6), bVar1)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Error: unsupported graph features");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
      }
      else {
        iVar2 = InputGraph::size((InputGraph *)0x1093ab);
        pvVar8 = (void *)std::ostream::operator<<(&std::cout,iVar2);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        local_3e8 = 0;
        while (iVar2 = local_3e8, iVar3 = InputGraph::size((InputGraph *)0x10940a), iVar2 < iVar3) {
          iVar2 = InputGraph::degree(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
          std::ostream::operator<<(&std::cout,iVar2);
          local_3ec = 0;
          while (iVar2 = local_3ec, iVar3 = InputGraph::size((InputGraph *)0x10946f), iVar2 < iVar3)
          {
            bVar1 = InputGraph::adjacent
                              ((InputGraph *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa6c,
                               in_stack_fffffffffffffa68);
            if (bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout," ");
              std::ostream::operator<<(poVar7,local_3ec);
            }
            local_3ec = local_3ec + 1;
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          local_3e8 = local_3e8 + 1;
        }
        local_4 = 0;
      }
      local_320 = 1;
      InputGraph::~InputGraph((InputGraph *)0x109543);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar7 = std::operator<<(poVar7,(char *)*local_10);
    poVar7 = std::operator<<(poVar7," [options] graph-file");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    pvVar8 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_90);
    std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_320 = 1;
  }
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffffa60);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)in_stack_fffffffffffffa60);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffffa60);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffffa60);
  return local_4;
}

Assistant:

auto main(int argc, char * argv[]) -> int
{
    try {
        po::options_description display_options{"Program options"};
        display_options.add_options()            //
            ("help", "Display help information") //
            ("format", po::value<string>(), "Specify input file format (auto, lad, labelledlad, dimacs)");

        po::options_description all_options{"All options"};
        all_options.add_options()("graph-file", "Specify the graph file");

        all_options.add(display_options);

        po::positional_options_description positional_options;
        positional_options
            .add("graph-file", 1);

        po::variables_map options_vars;
        po::store(po::command_line_parser(argc, argv)
                      .options(all_options)
                      .positional(positional_options)
                      .run(),
            options_vars);
        po::notify(options_vars);

        /* --help? Show a message, and exit. */
        if (options_vars.count("help")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            cout << endl;
            cout << display_options << endl;
            return EXIT_SUCCESS;
        }

        /* No input file specified? Show a message and exit. */
        if (! options_vars.count("graph-file")) {
            cout << "Usage: " << argv[0] << " [options] graph-file" << endl;
            return EXIT_FAILURE;
        }

        /* Read in the graphs */
        string pattern_format_name = options_vars.count("format") ? options_vars["format"].as<string>() : "auto";
        auto graph = read_file_format(pattern_format_name, options_vars["graph-file"].as<string>());

        if (graph.has_vertex_labels() || graph.has_edge_labels()) {
            cerr << "Error: unsupported graph features" << endl;
            return EXIT_FAILURE;
        }

        cout << graph.size() << endl;
        for (int i = 0; i < graph.size(); ++i) {
            cout << graph.degree(i);
            for (int j = 0; j < graph.size(); ++j)
                if (graph.adjacent(i, j))
                    cout << " " << j;
            cout << endl;
        }

        return EXIT_SUCCESS;
    }
    catch (const GraphFileError & e) {
        cerr << "Error: " << e.what() << endl;
        if (e.file_at_least_existed())
            cerr << "Maybe try specifying --format?" << endl;
        return EXIT_FAILURE;
    }
    catch (const po::error & e) {
        cerr << "Error: " << e.what() << endl;
        cerr << "Try " << argv[0] << " --help" << endl;
        return EXIT_FAILURE;
    }
    catch (const exception & e) {
        cerr << "Error: " << e.what() << endl;
        return EXIT_FAILURE;
    }
}